

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe_method.cpp
# Opt level: O0

void __thiscall RNG::~RNG(RNG *this)

{
  RNG *this_local;
  
  std::random_device::~random_device(&this->_rd);
  bm::Mark::~Mark(&this->_generate_mark);
  return;
}

Assistant:

int generate(int from, int to)
    {
        Bench::Probe probe(_generate_mark);

		std::uniform_int_distribution<int> dist(from, to);
        return dist(_rd);
    }